

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O0

char * bstr_make_cstr_x(uint8_t *pBegin,uint8_t *pEnd,uint16_t beginOffset,uint16_t endOffset)

{
  uint uVar1;
  uint uVar2;
  uint32_t strLen;
  uint32_t allocLen;
  uint8_t *str;
  uint16_t endOffset_local;
  uint16_t beginOffset_local;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  
  if (((pBegin == (uint8_t *)0x0) || (pEnd == (uint8_t *)0x0)) || (pBegin == (uint8_t *)0x0)) {
    pBegin_local = (uint8_t *)0x0;
  }
  else {
    uVar1 = (int)pEnd - (int)pBegin;
    uVar2 = uVar1 + beginOffset + (uint)endOffset;
    pBegin_local = (uint8_t *)malloc((ulong)(uVar2 + 1));
    if (pBegin_local != (uint8_t *)0x0) {
      memcpy(pBegin_local + (int)(uint)beginOffset,pBegin,(ulong)uVar1);
      pBegin_local[uVar2] = '\0';
    }
  }
  return (char *)pBegin_local;
}

Assistant:

char *bstr_make_cstr_x(const uint8_t *pBegin, const uint8_t *pEnd, uint16_t beginOffset, uint16_t endOffset){
   if( (pBegin != 0) && (pEnd != 0) && (pBegin)){
      uint8_t *str;
      uint32_t allocLen;
      uint32_t strLen = (uint32_t) (pEnd-pBegin);
      allocLen = strLen+beginOffset+endOffset+1;
      str = (uint8_t*) malloc(allocLen);
      if(str != 0){
         memcpy(str+beginOffset,pBegin,strLen);
         str[allocLen-1]=(uint8_t)0;
      }
      return (char*)str;
   }
   return 0;
}